

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O2

void __thiscall DIS::MinefieldDataPdu::unmarshal(MinefieldDataPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  TwoByteChunk x;
  Vector3Float local_48;
  
  MinefieldFamilyPdu::unmarshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_minefieldID,dataStream);
  EntityID::unmarshal(&this->_requestingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_minefieldSequenceNumbeer);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_pduSequenceNumber);
  DataStream::operator>>(dataStream,&this->_numberOfPdus);
  DataStream::operator>>(dataStream,&this->_numberOfMinesInThisPdu);
  DataStream::operator>>(dataStream,&this->_numberOfSensorTypes);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_dataFilter);
  EntityType::unmarshal(&this->_mineType,dataStream);
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::clear(&this->_sensorTypes);
  for (uVar1 = 0; uVar1 < this->_numberOfSensorTypes; uVar1 = uVar1 + 1) {
    TwoByteChunk::TwoByteChunk((TwoByteChunk *)&local_48);
    TwoByteChunk::unmarshal((TwoByteChunk *)&local_48,dataStream);
    std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::push_back
              (&this->_sensorTypes,(value_type *)&local_48);
    TwoByteChunk::~TwoByteChunk((TwoByteChunk *)&local_48);
  }
  DataStream::operator>>(dataStream,&this->_pad3);
  std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::clear(&this->_mineLocation);
  for (uVar1 = 0; uVar1 < this->_numberOfMinesInThisPdu; uVar1 = uVar1 + 1) {
    Vector3Float::Vector3Float(&local_48);
    Vector3Float::unmarshal(&local_48,dataStream);
    std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::push_back
              (&this->_mineLocation,&local_48);
    Vector3Float::~Vector3Float(&local_48);
  }
  return;
}

Assistant:

void MinefieldDataPdu::unmarshal(DataStream& dataStream)
{
    MinefieldFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _minefieldID.unmarshal(dataStream);
    _requestingEntityID.unmarshal(dataStream);
    dataStream >> _minefieldSequenceNumbeer;
    dataStream >> _requestID;
    dataStream >> _pduSequenceNumber;
    dataStream >> _numberOfPdus;
    dataStream >> _numberOfMinesInThisPdu;
    dataStream >> _numberOfSensorTypes;
    dataStream >> _pad2;
    dataStream >> _dataFilter;
    _mineType.unmarshal(dataStream);

     _sensorTypes.clear();
     for(size_t idx = 0; idx < _numberOfSensorTypes; idx++)
     {
        TwoByteChunk x;
        x.unmarshal(dataStream);
        _sensorTypes.push_back(x);
     }
    dataStream >> _pad3;

     _mineLocation.clear();
     for(size_t idx = 0; idx < _numberOfMinesInThisPdu; idx++)
     {
        Vector3Float x;
        x.unmarshal(dataStream);
        _mineLocation.push_back(x);
     }
}